

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaveLoadTests.cpp
# Opt level: O3

int testBasicSaveLoad(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  Arena *this;
  bool bVar3;
  int iVar4;
  Model *this_00;
  OneHotEncoder *this_01;
  StringVector *this_02;
  long *elem;
  ostream *poVar5;
  Rep *pRVar6;
  Model a2;
  string path;
  OneHotEncoder ohe;
  Result r;
  undefined1 local_118 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  string local_f0;
  string local_d0;
  Model local_b0;
  FeatureType local_98;
  FeatureType local_88;
  vector<long,_std::allocator<long>_> local_78;
  Result local_58;
  
  CoreML::Result::Result(&local_58);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/tmp/a.modelasset","");
  local_118._0_8_ = local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"");
  CoreML::OneHotEncoder::OneHotEncoder((OneHotEncoder *)&local_b0,(string *)local_118);
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"foo","");
  CoreML::FeatureType::String();
  CoreML::OneHotEncoder::addInput
            ((Result *)local_118,(OneHotEncoder *)&local_b0,&local_f0,&local_88);
  bVar3 = CoreML::Result::good((Result *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._8_8_ != &local_100) {
    operator_delete((void *)local_118._8_8_,local_100._0_8_ + 1);
  }
  if (local_88.m_type.
      super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.m_type.
               super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    this_00 = CoreML::Model::getProto(&local_b0);
    if (this_00->_oneof_case_[0] == 600) {
      this_01 = (this_00->Type_).onehotencoder_;
    }
    else {
      CoreML::Specification::Model::clear_Type(this_00);
      this_00->_oneof_case_[0] = 600;
      this_01 = (OneHotEncoder *)operator_new(0x28);
      CoreML::Specification::OneHotEncoder::OneHotEncoder(this_01);
      (this_00->Type_).onehotencoder_ = this_01;
    }
    if (this_01->_oneof_case_[0] == 1) {
      this_02 = (this_01->CategoryType_).stringcategories_;
    }
    else {
      CoreML::Specification::OneHotEncoder::clear_CategoryType(this_01);
      this_01->_oneof_case_[0] = 1;
      this_02 = (StringVector *)operator_new(0x30);
      CoreML::Specification::StringVector::StringVector(this_02);
      (this_01->CategoryType_).stringcategories_ = this_02;
    }
    pRVar6 = (this_02->vector_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar6 == (Rep *)0x0) {
      iVar4 = (this_02->vector_).super_RepeatedPtrFieldBase.total_size_;
LAB_0019af8b:
      google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                (&(this_02->vector_).super_RepeatedPtrFieldBase,iVar4 + 1);
      pRVar6 = (this_02->vector_).super_RepeatedPtrFieldBase.rep_;
      iVar4 = pRVar6->allocated_size;
LAB_0019af9d:
      pRVar6->allocated_size = iVar4 + 1;
      this = (this_02->vector_).super_RepeatedPtrFieldBase.arena_;
      if (this == (Arena *)0x0) {
        elem = (long *)operator_new(0x20);
        *elem = (long)(elem + 2);
        elem[1] = 0;
        *(undefined1 *)(elem + 2) = 0;
      }
      else {
        elem = (long *)google::protobuf::Arena::AllocateAligned
                                 (this,(type_info *)&std::__cxx11::string::typeinfo,0x20);
        *elem = (long)(elem + 2);
        elem[1] = 0;
        *(undefined1 *)(elem + 2) = 0;
        google::protobuf::Arena::AddListNode
                  (this,elem,google::protobuf::internal::arena_destruct_object<std::__cxx11::string>
                  );
        pRVar6 = (this_02->vector_).super_RepeatedPtrFieldBase.rep_;
      }
      iVar4 = (this_02->vector_).super_RepeatedPtrFieldBase.current_size_;
      (this_02->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
      pRVar6->elements[iVar4] = elem;
    }
    else {
      iVar2 = (this_02->vector_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = pRVar6->allocated_size;
      if (iVar4 <= iVar2) {
        if (iVar4 == (this_02->vector_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0019af8b;
        goto LAB_0019af9d;
      }
      (this_02->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
      elem = (long *)pRVar6->elements[iVar2];
    }
    std::__cxx11::string::_M_replace((ulong)elem,0,(char *)elem[1],0x324847);
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"bar","");
    local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    CoreML::FeatureType::Array(&local_98,&local_78);
    CoreML::Model::addOutput((Result *)local_118,&local_b0,&local_f0,&local_98);
    bVar3 = CoreML::Result::good((Result *)local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._8_8_ != &local_100) {
      operator_delete((void *)local_118._8_8_,local_100._0_8_ + 1);
    }
    if (local_98.m_type.
        super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.m_type.
                 super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      CoreML::Model::save((Result *)local_118,&local_b0,&local_d0);
      bVar3 = CoreML::Result::good((Result *)local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._8_8_ != &local_100) {
        operator_delete((void *)local_118._8_8_,local_100._0_8_ + 1);
      }
      if (bVar3) {
        CoreML::Model::Model((Model *)&local_f0);
        CoreML::Model::load((Result *)local_118,&local_d0,(Model *)&local_f0);
        bVar3 = CoreML::Result::good((Result *)local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._8_8_ != &local_100) {
          operator_delete((void *)local_118._8_8_,local_100._0_8_ + 1);
        }
        if (bVar3) {
          bVar3 = CoreML::Model::operator==(&local_b0,(Model *)&local_f0);
          if (!bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                       ,0x6d);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1a);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(ohe) == (a2)",0xd);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5," was false, expected true.",0x1a);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            goto LAB_0019b507;
          }
          iVar4 = remove(local_d0._M_dataplus._M_p);
          if (iVar4 == 0) {
            iVar4 = 0;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                       ,0x6d);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1b);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"(std::remove(path.c_str())) == (0)",0x22);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5," was false, expected true.",0x1a);
            iVar4 = 1;
            std::endl<char,std::char_traits<char>>(poVar5);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                     ,0x6d);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x19);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"(Model::load(path, a2)).good()",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
LAB_0019b507:
          std::ostream::put((char)poVar5);
          iVar4 = 1;
          std::ostream::flush();
        }
        CoreML::Model::~Model((Model *)&local_f0);
        goto LAB_0019b37f;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                 ,0x6d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(ohe.save(path)).good()",0x17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                 ,0x6d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"(ohe.addOutput(\"bar\", FeatureType::Array({}))).good()",0x35);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
               ,0x6d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"(ohe.addInput(\"foo\", FeatureType::String())).good()",0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  }
  std::ostream::put((char)poVar5);
  iVar4 = 1;
  std::ostream::flush();
LAB_0019b37f:
  CoreML::Model::~Model(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_message._M_dataplus._M_p != &local_58.m_message.field_2) {
    operator_delete(local_58.m_message._M_dataplus._M_p,
                    local_58.m_message.field_2._M_allocated_capacity + 1);
  }
  return iVar4;
}

Assistant:

int testBasicSaveLoad () {
    Result r;
    
    const std::string path("/tmp/a.modelasset");
    OneHotEncoder ohe;
    ML_ASSERT_GOOD(ohe.addInput("foo", FeatureType::String()));
    ohe.getProto().mutable_onehotencoder()->mutable_stringcategories()->add_vector()->assign("foo");
    ML_ASSERT_GOOD(ohe.addOutput("bar", FeatureType::Array({})));
    ML_ASSERT_GOOD(ohe.save(path));
    Model a2;
    ML_ASSERT_GOOD(Model::load(path, a2));
    ML_ASSERT_EQ(ohe, a2);
    ML_ASSERT_EQ(std::remove(path.c_str()), 0);
    
    return 0;
}